

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_leaky_relu(ggml_context *ctx,ggml_tensor *a,float negative_slope,_Bool inplace)

{
  ggml_tensor *tensor;
  undefined7 in_register_00000011;
  float negative_slope_local;
  
  if ((int)CONCAT71(in_register_00000011,inplace) == 0) {
    tensor = ggml_dup_tensor(ctx,a);
  }
  else {
    tensor = ggml_view_tensor(ctx,a);
  }
  ggml_set_op_params(tensor,&negative_slope_local,4);
  tensor->op = GGML_OP_LEAKY_RELU;
  tensor->src[0] = a;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_leaky_relu(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        float                 negative_slope,
        bool                  inplace) {
    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    ggml_set_op_params(result, &negative_slope, sizeof(negative_slope));

    result->op     = GGML_OP_LEAKY_RELU;
    result->src[0] = a;

    return result;
}